

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O1

void ConvertRGBA32ToUV_SSE2(uint16_t *rgb,uint8_t *u,uint8_t *v,int width)

{
  undefined1 (*pauVar1) [16];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  uint uVar39;
  undefined1 auVar40 [16];
  undefined2 uVar42;
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [12];
  undefined1 auVar52 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [12];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined4 uVar83;
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  
  auVar38 = _DAT_001b89a0;
  auVar37 = _DAT_001b8990;
  auVar36 = _DAT_001b8970;
  auVar35 = _DAT_001b8960;
  uVar39 = width & 0xfffffff0;
  if (0 < (int)uVar39) {
    pauVar1 = (undefined1 (*) [16])(rgb + (int)(uVar39 * 4));
    do {
      auVar40 = *(undefined1 (*) [16])rgb;
      auVar41 = *(undefined1 (*) [16])((long)rgb + 0x10);
      auVar60 = *(undefined1 (*) [16])((long)rgb + 0x20);
      auVar48 = *(undefined1 (*) [16])((long)rgb + 0x30);
      auVar69._0_12_ = auVar40._0_12_;
      auVar69._12_2_ = auVar40._6_2_;
      auVar69._14_2_ = auVar41._6_2_;
      auVar68._12_4_ = auVar69._12_4_;
      auVar68._0_10_ = auVar40._0_10_;
      auVar68._10_2_ = auVar41._4_2_;
      auVar67._10_6_ = auVar68._10_6_;
      auVar67._0_8_ = auVar40._0_8_;
      auVar67._8_2_ = auVar40._4_2_;
      uVar42 = auVar41._2_2_;
      auVar74._2_8_ = auVar67._8_8_;
      auVar74._0_2_ = uVar42;
      auVar74._10_6_ = 0;
      auVar70._12_4_ = 0;
      auVar70._0_12_ = SUB1612(auVar74 << 0x30,4);
      auVar70 = auVar70 << 0x20;
      auVar79._0_12_ = auVar70._0_12_;
      auVar79._12_2_ = uVar42;
      auVar79._14_2_ = auVar41._10_2_;
      auVar78._12_4_ = auVar79._12_4_;
      auVar78._0_10_ = auVar70._0_10_;
      auVar78._10_2_ = auVar40._10_2_;
      auVar77._10_6_ = auVar78._10_6_;
      auVar77._0_8_ = auVar70._0_8_;
      auVar77._8_2_ = auVar40._2_2_;
      uVar83 = auVar77._8_4_;
      auVar51._0_8_ = CONCAT44(auVar78._12_4_,uVar83);
      auVar51._8_4_ = uVar83;
      auVar56._12_2_ = auVar41._10_2_;
      auVar56._0_12_ = auVar51;
      auVar56._14_2_ = auVar41._12_2_;
      auVar55._12_4_ = auVar56._12_4_;
      auVar55._0_10_ = auVar51._0_10_;
      auVar55._10_2_ = auVar41._4_2_;
      auVar54._10_6_ = auVar55._10_6_;
      auVar54._8_2_ = uVar42;
      auVar54._0_8_ = auVar51._0_8_;
      auVar53._8_8_ = auVar54._8_8_;
      auVar53._6_2_ = auVar40._12_2_;
      auVar53._4_2_ = auVar40._10_2_;
      auVar53._0_4_ = uVar83;
      auVar52._4_12_ = auVar53._4_12_;
      auVar52._0_4_ = auVar40._2_4_;
      auVar40._0_8_ = CONCAT44(auVar40._8_4_,auVar40._0_4_);
      auVar40._8_4_ = auVar41._0_4_;
      auVar40._12_4_ = auVar41._8_4_;
      auVar43._0_8_ = CONCAT44(auVar60._8_4_,auVar60._0_4_);
      auVar43._8_4_ = auVar48._0_4_;
      auVar43._12_4_ = auVar48._8_4_;
      auVar47._0_4_ = auVar60._2_4_;
      auVar47._4_2_ = auVar60._10_2_;
      auVar47._6_2_ = auVar60._12_2_;
      auVar47._8_2_ = auVar48._2_2_;
      auVar47._10_2_ = auVar48._4_2_;
      auVar47._12_2_ = auVar48._10_2_;
      auVar47._14_2_ = auVar48._12_2_;
      auVar60._8_4_ = auVar41._0_4_;
      auVar60._0_8_ = auVar40._0_8_;
      auVar60._12_4_ = auVar41._8_4_;
      auVar41 = pmaddwd(auVar60,auVar35);
      auVar59._8_4_ = auVar48._0_4_;
      auVar59._0_8_ = auVar43._0_8_;
      auVar59._12_4_ = auVar48._8_4_;
      auVar60 = pmaddwd(auVar59,auVar35);
      auVar70 = pmaddwd(auVar52,auVar36);
      auVar74 = pmaddwd(auVar47,auVar36);
      auVar48._0_4_ = auVar41._0_4_ + 0x2020000 + auVar70._0_4_ >> 0x12;
      auVar48._4_4_ = auVar41._4_4_ + 0x2020000 + auVar70._4_4_ >> 0x12;
      auVar48._8_4_ = auVar41._8_4_ + 0x2020000 + auVar70._8_4_ >> 0x12;
      auVar48._12_4_ = auVar41._12_4_ + 0x2020000 + auVar70._12_4_ >> 0x12;
      auVar61._0_4_ = auVar60._0_4_ + 0x2020000 + auVar74._0_4_ >> 0x12;
      auVar61._4_4_ = auVar60._4_4_ + 0x2020000 + auVar74._4_4_ >> 0x12;
      auVar61._8_4_ = auVar60._8_4_ + 0x2020000 + auVar74._8_4_ >> 0x12;
      auVar61._12_4_ = auVar60._12_4_ + 0x2020000 + auVar74._12_4_ >> 0x12;
      auVar74 = packssdw(auVar48,auVar61);
      auVar40 = pmaddwd(auVar40,auVar37);
      auVar60 = pmaddwd(auVar43,auVar37);
      auVar70 = pmaddwd(auVar52,auVar38);
      auVar48 = pmaddwd(auVar47,auVar38);
      auVar41._0_4_ = auVar40._0_4_ + 0x2020000 + auVar70._0_4_ >> 0x12;
      auVar41._4_4_ = auVar40._4_4_ + 0x2020000 + auVar70._4_4_ >> 0x12;
      auVar41._8_4_ = auVar40._8_4_ + 0x2020000 + auVar70._8_4_ >> 0x12;
      auVar41._12_4_ = auVar40._12_4_ + 0x2020000 + auVar70._12_4_ >> 0x12;
      auVar44._0_4_ = auVar60._0_4_ + 0x2020000 + auVar48._0_4_ >> 0x12;
      auVar44._4_4_ = auVar60._4_4_ + 0x2020000 + auVar48._4_4_ >> 0x12;
      auVar44._8_4_ = auVar60._8_4_ + 0x2020000 + auVar48._8_4_ >> 0x12;
      auVar44._12_4_ = auVar60._12_4_ + 0x2020000 + auVar48._12_4_ >> 0x12;
      auVar70 = packssdw(auVar41,auVar44);
      auVar40 = *(undefined1 (*) [16])((long)rgb + 0x40);
      auVar41 = *(undefined1 (*) [16])((long)rgb + 0x50);
      auVar60 = *(undefined1 (*) [16])((long)rgb + 0x60);
      auVar48 = *(undefined1 (*) [16])((long)rgb + 0x70);
      auVar82._0_12_ = auVar40._0_12_;
      auVar82._12_2_ = auVar40._6_2_;
      auVar82._14_2_ = auVar41._6_2_;
      auVar81._12_4_ = auVar82._12_4_;
      auVar81._0_10_ = auVar40._0_10_;
      auVar81._10_2_ = auVar41._4_2_;
      auVar80._10_6_ = auVar81._10_6_;
      auVar80._0_8_ = auVar40._0_8_;
      auVar80._8_2_ = auVar40._4_2_;
      uVar42 = auVar41._2_2_;
      auVar34._2_8_ = auVar80._8_8_;
      auVar34._0_2_ = uVar42;
      auVar34._10_6_ = 0;
      auVar73._12_4_ = 0;
      auVar73._0_12_ = SUB1612(auVar34 << 0x30,4);
      auVar73 = auVar73 << 0x20;
      auVar86._0_12_ = auVar73._0_12_;
      auVar86._12_2_ = uVar42;
      auVar86._14_2_ = auVar41._10_2_;
      auVar85._12_4_ = auVar86._12_4_;
      auVar85._0_10_ = auVar73._0_10_;
      auVar85._10_2_ = auVar40._10_2_;
      auVar84._10_6_ = auVar85._10_6_;
      auVar84._0_8_ = auVar73._0_8_;
      auVar84._8_2_ = auVar40._2_2_;
      uVar83 = auVar84._8_4_;
      auVar58._0_8_ = CONCAT44(auVar85._12_4_,uVar83);
      auVar58._8_4_ = uVar83;
      auVar66._12_2_ = auVar41._10_2_;
      auVar66._0_12_ = auVar58;
      auVar66._14_2_ = auVar41._12_2_;
      auVar65._12_4_ = auVar66._12_4_;
      auVar65._0_10_ = auVar58._0_10_;
      auVar65._10_2_ = auVar41._4_2_;
      auVar64._10_6_ = auVar65._10_6_;
      auVar64._8_2_ = uVar42;
      auVar64._0_8_ = auVar58._0_8_;
      auVar63._8_8_ = auVar64._8_8_;
      auVar63._6_2_ = auVar40._12_2_;
      auVar63._4_2_ = auVar40._10_2_;
      auVar63._0_4_ = uVar83;
      auVar62._4_12_ = auVar63._4_12_;
      auVar62._0_4_ = auVar40._2_4_;
      auVar45._0_8_ = CONCAT44(auVar40._8_4_,auVar40._0_4_);
      auVar45._8_4_ = auVar41._0_4_;
      auVar45._12_4_ = auVar41._8_4_;
      auVar49._0_8_ = CONCAT44(auVar60._8_4_,auVar60._0_4_);
      auVar49._8_4_ = auVar48._0_4_;
      auVar49._12_4_ = auVar48._8_4_;
      auVar57._0_4_ = auVar60._2_4_;
      auVar57._4_2_ = auVar60._10_2_;
      auVar57._6_2_ = auVar60._12_2_;
      auVar57._8_2_ = auVar48._2_2_;
      auVar57._10_2_ = auVar48._4_2_;
      auVar57._12_2_ = auVar48._10_2_;
      auVar57._14_2_ = auVar48._12_2_;
      auVar71._8_4_ = auVar41._0_4_;
      auVar71._0_8_ = auVar45._0_8_;
      auVar71._12_4_ = auVar41._8_4_;
      auVar40 = pmaddwd(auVar71,auVar35);
      auVar75._8_4_ = auVar48._0_4_;
      auVar75._0_8_ = auVar49._0_8_;
      auVar75._12_4_ = auVar48._8_4_;
      auVar41 = pmaddwd(auVar75,auVar35);
      auVar60 = pmaddwd(auVar62,auVar36);
      auVar48 = pmaddwd(auVar57,auVar36);
      auVar72._0_4_ = auVar40._0_4_ + 0x2020000 + auVar60._0_4_ >> 0x12;
      auVar72._4_4_ = auVar40._4_4_ + 0x2020000 + auVar60._4_4_ >> 0x12;
      auVar72._8_4_ = auVar40._8_4_ + 0x2020000 + auVar60._8_4_ >> 0x12;
      auVar72._12_4_ = auVar40._12_4_ + 0x2020000 + auVar60._12_4_ >> 0x12;
      auVar76._0_4_ = auVar41._0_4_ + 0x2020000 + auVar48._0_4_ >> 0x12;
      auVar76._4_4_ = auVar41._4_4_ + 0x2020000 + auVar48._4_4_ >> 0x12;
      auVar76._8_4_ = auVar41._8_4_ + 0x2020000 + auVar48._8_4_ >> 0x12;
      auVar76._12_4_ = auVar41._12_4_ + 0x2020000 + auVar48._12_4_ >> 0x12;
      auVar73 = packssdw(auVar72,auVar76);
      sVar2 = auVar74._0_2_;
      sVar4 = auVar74._2_2_;
      sVar6 = auVar74._4_2_;
      sVar8 = auVar74._6_2_;
      sVar10 = auVar74._8_2_;
      sVar12 = auVar74._10_2_;
      sVar14 = auVar74._12_2_;
      sVar16 = auVar74._14_2_;
      sVar18 = auVar73._0_2_;
      sVar20 = auVar73._2_2_;
      sVar22 = auVar73._4_2_;
      sVar24 = auVar73._6_2_;
      sVar26 = auVar73._8_2_;
      sVar28 = auVar73._10_2_;
      sVar30 = auVar73._12_2_;
      sVar32 = auVar73._14_2_;
      auVar40 = pmaddwd(auVar45,auVar37);
      auVar41 = pmaddwd(auVar49,auVar37);
      auVar48 = pmaddwd(auVar62,auVar38);
      auVar60 = pmaddwd(auVar57,auVar38);
      auVar46._0_4_ = auVar40._0_4_ + 0x2020000 + auVar48._0_4_ >> 0x12;
      auVar46._4_4_ = auVar40._4_4_ + 0x2020000 + auVar48._4_4_ >> 0x12;
      auVar46._8_4_ = auVar40._8_4_ + 0x2020000 + auVar48._8_4_ >> 0x12;
      auVar46._12_4_ = auVar40._12_4_ + 0x2020000 + auVar48._12_4_ >> 0x12;
      auVar50._0_4_ = auVar41._0_4_ + 0x2020000 + auVar60._0_4_ >> 0x12;
      auVar50._4_4_ = auVar41._4_4_ + 0x2020000 + auVar60._4_4_ >> 0x12;
      auVar50._8_4_ = auVar41._8_4_ + 0x2020000 + auVar60._8_4_ >> 0x12;
      auVar50._12_4_ = auVar41._12_4_ + 0x2020000 + auVar60._12_4_ >> 0x12;
      auVar40 = packssdw(auVar46,auVar50);
      sVar3 = auVar70._0_2_;
      sVar5 = auVar70._2_2_;
      sVar7 = auVar70._4_2_;
      sVar9 = auVar70._6_2_;
      sVar11 = auVar70._8_2_;
      sVar13 = auVar70._10_2_;
      sVar15 = auVar70._12_2_;
      sVar17 = auVar70._14_2_;
      sVar19 = auVar40._0_2_;
      sVar21 = auVar40._2_2_;
      sVar23 = auVar40._4_2_;
      sVar25 = auVar40._6_2_;
      sVar27 = auVar40._8_2_;
      sVar29 = auVar40._10_2_;
      sVar31 = auVar40._12_2_;
      sVar33 = auVar40._14_2_;
      *u = (0 < sVar2) * (sVar2 < 0x100) * auVar74[0] - (0xff < sVar2);
      u[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar74[2] - (0xff < sVar4);
      u[2] = (0 < sVar6) * (sVar6 < 0x100) * auVar74[4] - (0xff < sVar6);
      u[3] = (0 < sVar8) * (sVar8 < 0x100) * auVar74[6] - (0xff < sVar8);
      u[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar74[8] - (0xff < sVar10);
      u[5] = (0 < sVar12) * (sVar12 < 0x100) * auVar74[10] - (0xff < sVar12);
      u[6] = (0 < sVar14) * (sVar14 < 0x100) * auVar74[0xc] - (0xff < sVar14);
      u[7] = (0 < sVar16) * (sVar16 < 0x100) * auVar74[0xe] - (0xff < sVar16);
      u[8] = (0 < sVar18) * (sVar18 < 0x100) * auVar73[0] - (0xff < sVar18);
      u[9] = (0 < sVar20) * (sVar20 < 0x100) * auVar73[2] - (0xff < sVar20);
      u[10] = (0 < sVar22) * (sVar22 < 0x100) * auVar73[4] - (0xff < sVar22);
      u[0xb] = (0 < sVar24) * (sVar24 < 0x100) * auVar73[6] - (0xff < sVar24);
      u[0xc] = (0 < sVar26) * (sVar26 < 0x100) * auVar73[8] - (0xff < sVar26);
      u[0xd] = (0 < sVar28) * (sVar28 < 0x100) * auVar73[10] - (0xff < sVar28);
      u[0xe] = (0 < sVar30) * (sVar30 < 0x100) * auVar73[0xc] - (0xff < sVar30);
      u[0xf] = (0 < sVar32) * (sVar32 < 0x100) * auVar73[0xe] - (0xff < sVar32);
      *v = (0 < sVar3) * (sVar3 < 0x100) * auVar70[0] - (0xff < sVar3);
      v[1] = (0 < sVar5) * (sVar5 < 0x100) * auVar70[2] - (0xff < sVar5);
      v[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar70[4] - (0xff < sVar7);
      v[3] = (0 < sVar9) * (sVar9 < 0x100) * auVar70[6] - (0xff < sVar9);
      v[4] = (0 < sVar11) * (sVar11 < 0x100) * auVar70[8] - (0xff < sVar11);
      v[5] = (0 < sVar13) * (sVar13 < 0x100) * auVar70[10] - (0xff < sVar13);
      v[6] = (0 < sVar15) * (sVar15 < 0x100) * auVar70[0xc] - (0xff < sVar15);
      v[7] = (0 < sVar17) * (sVar17 < 0x100) * auVar70[0xe] - (0xff < sVar17);
      v[8] = (0 < sVar19) * (sVar19 < 0x100) * auVar40[0] - (0xff < sVar19);
      v[9] = (0 < sVar21) * (sVar21 < 0x100) * auVar40[2] - (0xff < sVar21);
      v[10] = (0 < sVar23) * (sVar23 < 0x100) * auVar40[4] - (0xff < sVar23);
      v[0xb] = (0 < sVar25) * (sVar25 < 0x100) * auVar40[6] - (0xff < sVar25);
      v[0xc] = (0 < sVar27) * (sVar27 < 0x100) * auVar40[8] - (0xff < sVar27);
      v[0xd] = (0 < sVar29) * (sVar29 < 0x100) * auVar40[10] - (0xff < sVar29);
      v[0xe] = (0 < sVar31) * (sVar31 < 0x100) * auVar40[0xc] - (0xff < sVar31);
      v[0xf] = (0 < sVar33) * (sVar33 < 0x100) * auVar40[0xe] - (0xff < sVar33);
      u = u + 0x10;
      v = v + 0x10;
      rgb = (uint16_t *)((long)rgb + 0x80);
    } while (rgb < pauVar1);
  }
  if (uVar39 == width) {
    return;
  }
  WebPConvertRGBA32ToUV_C(rgb,u,v,width & 0xf);
  return;
}

Assistant:

static void ConvertRGBA32ToUV_SSE2(const uint16_t* WEBP_RESTRICT rgb,
                                   uint8_t* WEBP_RESTRICT u,
                                   uint8_t* WEBP_RESTRICT v, int width) {
  const int max_width = width & ~15;
  const uint16_t* const last_rgb = rgb + 4 * max_width;
  while (rgb < last_rgb) {
    __m128i r, g, b, U0, V0, U1, V1;
    RGBA32PackedToPlanar_16b_SSE2(rgb +  0, &r, &g, &b);
    ConvertRGBToUV_SSE2(&r, &g, &b, &U0, &V0);
    RGBA32PackedToPlanar_16b_SSE2(rgb + 32, &r, &g, &b);
    ConvertRGBToUV_SSE2(&r, &g, &b, &U1, &V1);
    STORE_16(_mm_packus_epi16(U0, U1), u);
    STORE_16(_mm_packus_epi16(V0, V1), v);
    u += 16;
    v += 16;
    rgb += 2 * 32;
  }
  if (max_width < width) {  // left-over
    WebPConvertRGBA32ToUV_C(rgb, u, v, width - max_width);
  }
}